

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::CanFunctionObjectHaveInlineCaches(FunctionBody *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  LocalFunctionId functionId;
  uint uVar4;
  uint uVar5;
  
  if (((this->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) {
    return false;
  }
  bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this);
  if (!bVar1) {
    uVar2 = GetInlineCacheCount(this);
    uVar3 = GetIsInstInlineCacheCount(this);
    uVar4 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01436260,ScriptFunctionWithInlineCachePhase,uVar4,
                              functionId);
    if ((uVar3 + uVar2 != 0) && (bVar1)) {
      return true;
    }
    uVar5 = DAT_0143c028 + DAT_0143c014;
    if ((-1 < (int)uVar5) && (uVar4 = GetByteCodeWithoutLDACount(this), uVar4 <= uVar5)) {
      return (uVar3 + uVar2) - 1 < DAT_01441e98 && -1 < (int)DAT_01441e98;
    }
  }
  return false;
}

Assistant:

bool FunctionBody::CanFunctionObjectHaveInlineCaches()
    {
        if (this->DoStackNestedFunc() || this->IsCoroutine())
        {
            return false;
        }

        uint totalCacheCount = this->GetInlineCacheCount() + this->GetIsInstInlineCacheCount();
        if (PHASE_FORCE(Js::ScriptFunctionWithInlineCachePhase, this) && totalCacheCount > 0)
        {
            return true;
        }

        // Only have inline caches on function object for possible inlining candidates.
        // Since we don't know the size of the top function, check against the maximum possible inline threshold
        // Negative inline byte code size threshold will disable inline cache on function object.
        const int byteCodeSizeThreshold = CONFIG_FLAG(InlineThreshold) + CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
        if (byteCodeSizeThreshold < 0 || this->GetByteCodeWithoutLDACount() > (uint)byteCodeSizeThreshold)
        {
            return false;
        }
        // Negative FuncObjectInlineCacheThreshold will disable inline cache on function object.
        if (CONFIG_FLAG(FuncObjectInlineCacheThreshold) < 0 || totalCacheCount > (uint)CONFIG_FLAG(FuncObjectInlineCacheThreshold) || totalCacheCount == 0)
        {
            return false;
        }

        return true;
    }